

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

void __thiscall QScrollBar::mousePressEvent(QScrollBar *this,QMouseEvent *e)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  MouseButton MVar4;
  SubControl SVar5;
  int iVar6;
  int iVar7;
  QScrollBarPrivate *pQVar8;
  QStyle *pQVar9;
  QScrollBarPrivate *pQVar10;
  long lVar11;
  QSinglePointEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int initialDelay;
  int sliderLength;
  bool midButtonAbsPos;
  QScrollBarPrivate *d;
  QElapsedTimer time;
  QPoint pressValue;
  QPoint click;
  QRect sr;
  QStyleOptionSlider opt;
  undefined4 in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  QScrollBarPrivate *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  QRect *in_stack_fffffffffffffe60;
  int pos;
  QScrollBarPrivate *in_stack_fffffffffffffe68;
  int local_18c;
  QElapsedTimer local_138;
  QPointF local_128;
  QPoint local_118;
  QPointF local_110;
  QPoint local_100;
  QPoint local_f8;
  QPoint local_f0;
  QPoint local_e8;
  QPoint local_e0;
  QPointF local_d8;
  QPoint local_c8;
  undefined1 local_c0 [16];
  QPointF local_b0;
  QPoint local_9c;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_94;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_90;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_8c;
  undefined1 local_88 [124];
  Int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = d_func((QScrollBar *)0x67cd65);
  bVar1 = QBasicTimer::isActive(&(pQVar8->super_QAbstractSliderPrivate).repeatActionTimer);
  if (bVar1) {
    QScrollBarPrivate::stopRepeatAction
              ((QScrollBarPrivate *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  iVar2 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,2,0,in_RDI);
  memcpy(local_88,&DAT_00b22358,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x67cde5);
  (**(code **)(*in_RDI + 0x1a8))(in_RDI,local_88);
  local_8c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (QFlagsStorage<Qt::KeyboardModifier>)
       QInputEvent::modifiers
                 ((QInputEvent *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  bVar1 = true;
  local_c = (Int)local_8c.super_QFlagsStorage<Qt::KeyboardModifier>.i;
  if ((pQVar8->super_QAbstractSliderPrivate).maximum !=
      *(int *)&(pQVar8->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254) {
    local_94.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QSinglePointEvent::buttons
                   ((QSinglePointEvent *)
                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    QSinglePointEvent::button(in_RSI);
    local_90.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QFlags<Qt::MouseButton>::operator&
                   ((QFlags<Qt::MouseButton> *)
                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                    in_stack_fffffffffffffe3c);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_90);
    bVar1 = true;
    if (IVar3 == 0) {
      MVar4 = QSinglePointEvent::button(in_RSI);
      bVar1 = true;
      if ((MVar4 != LeftButton) && (bVar1 = false, iVar2 != 0)) {
        MVar4 = QSinglePointEvent::button(in_RSI);
        bVar1 = MVar4 == MiddleButton;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  if (bVar1) {
    QEvent::ignore((QEvent *)in_RSI);
    goto LAB_0067d45b;
  }
  pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_b0 = QSinglePointEvent::position((QSinglePointEvent *)0x67cf0e);
  local_9c = QPointF::toPoint((QPointF *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  SVar5 = (**(code **)(*(long *)pQVar9 + 0xd0))(pQVar9,2,local_88,&local_9c,in_RDI);
  pQVar8->pressedControl = SVar5;
  pQVar8->pointerOutsidePressedControl = false;
  local_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_c0 = (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,2,local_88,0x40,in_RDI);
  local_c8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = QSinglePointEvent::position((QSinglePointEvent *)0x67cfea);
  local_c8 = QPointF::toPoint((QPointF *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  local_e0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_f0 = QRect::center(in_stack_fffffffffffffe60);
  pos = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_e8 = ::operator-((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (QPoint *)in_stack_fffffffffffffe48);
  local_f8 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  local_e0 = ::operator+((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         (QPoint *)in_stack_fffffffffffffe48);
  if ((pQVar8->super_QAbstractSliderPrivate).orientation == Horizontal) {
    in_stack_fffffffffffffe68 = pQVar8;
    QPoint::x((QPoint *)0x67d0a9);
    local_18c = QScrollBarPrivate::pixelPosToRangeValue(in_stack_fffffffffffffe68,pos);
  }
  else {
    pQVar10 = pQVar8;
    QPoint::y((QPoint *)0x67d0d2);
    pos = (int)((ulong)pQVar10 >> 0x20);
    local_18c = QScrollBarPrivate::pixelPosToRangeValue(in_stack_fffffffffffffe68,pos);
  }
  (pQVar8->super_QAbstractSliderPrivate).pressValue = local_18c;
  if (pQVar8->pressedControl == SC_ScrollBarSlider) {
    pQVar10 = d_func((QScrollBar *)0x67d10d);
    if ((pQVar10->super_QAbstractSliderPrivate).orientation == Horizontal) {
      iVar6 = QPoint::x((QPoint *)0x67d123);
      iVar7 = QRect::x((QRect *)0x67d134);
      iVar6 = iVar6 - iVar7;
    }
    else {
      in_stack_fffffffffffffe54 = QPoint::y((QPoint *)0x67d14f);
      iVar6 = QRect::y((QRect *)0x67d160);
      iVar6 = in_stack_fffffffffffffe54 - iVar6;
    }
    pQVar8->clickOffset = iVar6;
    pQVar8->snapBackPosition = (pQVar8->super_QAbstractSliderPrivate).position;
  }
  if ((pQVar8->pressedControl == SC_ComboBoxArrow) ||
     (pQVar8->pressedControl == SC_ComboBoxListBoxPopup)) {
    if (iVar2 != 0) {
      MVar4 = QSinglePointEvent::button(in_RSI);
      if (MVar4 != MiddleButton) goto LAB_0067d1c7;
LAB_0067d20e:
      pQVar10 = d_func((QScrollBar *)0x67d218);
      if ((pQVar10->super_QAbstractSliderPrivate).orientation == Horizontal) {
        iVar2 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38))
        ;
      }
      else {
        iVar2 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                             );
      }
      in_stack_fffffffffffffe48 = pQVar8;
      in_stack_fffffffffffffe50 = iVar2;
      pQVar10 = d_func((QScrollBar *)0x67d261);
      if ((pQVar10->super_QAbstractSliderPrivate).orientation == Horizontal) {
        local_110 = QSinglePointEvent::position((QSinglePointEvent *)0x67d274);
        local_100 = QPointF::toPoint((QPointF *)
                                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        in_stack_fffffffffffffe44 = QPoint::x((QPoint *)0x67d2a8);
      }
      else {
        local_128 = QSinglePointEvent::position((QSinglePointEvent *)0x67d2b8);
        local_118 = QPointF::toPoint((QPointF *)
                                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        in_stack_fffffffffffffe44 = QPoint::y((QPoint *)0x67d2ec);
      }
      QScrollBarPrivate::pixelPosToRangeValue(in_stack_fffffffffffffe68,pos);
      QAbstractSlider::setSliderPosition
                ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      pQVar8->pressedControl = SC_ScrollBarSlider;
      pQVar8->clickOffset = iVar2 / 2;
    }
    else {
LAB_0067d1c7:
      pQVar9 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      iVar2 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x27,local_88,in_RDI,0);
      if (iVar2 != 0) {
        MVar4 = QSinglePointEvent::button(in_RSI);
        if (MVar4 == LeftButton) goto LAB_0067d20e;
      }
    }
  }
  iVar2 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_138.t1 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_138.t2 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QElapsedTimer::QElapsedTimer(&local_138);
  QElapsedTimer::start();
  QScrollBarPrivate::activateControl
            ((QScrollBarPrivate *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48);
  pQVar9 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  (**(code **)(*(long *)pQVar9 + 0xd8))(pQVar9,2,local_88,pQVar8->pressedControl,in_RDI);
  QWidget::repaint((QWidget *)in_stack_fffffffffffffe48,
                   (QRect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  lVar11 = QElapsedTimer::elapsed();
  if (499 < lVar11) {
    bVar1 = QBasicTimer::isActive(&(pQVar8->super_QAbstractSliderPrivate).repeatActionTimer);
    if (bVar1) {
      QBasicTimer::start((QBasicTimer *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),iVar2,
                         (QObject *)in_stack_fffffffffffffe48);
    }
  }
  if (pQVar8->pressedControl == SC_ScrollBarSlider) {
    QAbstractSlider::setSliderDown
              ((QAbstractSlider *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
  }
LAB_0067d45b:
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x67d468);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBar::mousePressEvent(QMouseEvent *e)
{
    Q_D(QScrollBar);

    if (d->repeatActionTimer.isActive())
        d->stopRepeatAction();

    bool midButtonAbsPos = style()->styleHint(QStyle::SH_ScrollBar_MiddleClickAbsolutePosition,
                                             nullptr, this);
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    opt.keyboardModifiers = e->modifiers();

    if (d->maximum == d->minimum // no range
        || (e->buttons() & (~e->button())) // another button was clicked before
        || !(e->button() == Qt::LeftButton || (midButtonAbsPos && e->button() == Qt::MiddleButton))) {
        e->ignore();
        return;
    }

    d->pressedControl = style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, e->position().toPoint(), this);
    d->pointerOutsidePressedControl = false;

    QRect sr = style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                       QStyle::SC_ScrollBarSlider, this);
    QPoint click = e->position().toPoint();
    QPoint pressValue = click - sr.center() + sr.topLeft();
    d->pressValue = d->orientation == Qt::Horizontal ? d->pixelPosToRangeValue(pressValue.x()) :
        d->pixelPosToRangeValue(pressValue.y());
    if (d->pressedControl == QStyle::SC_ScrollBarSlider) {
        d->clickOffset = HORIZONTAL ? (click.x()-sr.x()) : (click.y()-sr.y());
        d->snapBackPosition = d->position;
    }

    if ((d->pressedControl == QStyle::SC_ScrollBarAddPage
          || d->pressedControl == QStyle::SC_ScrollBarSubPage)
        && ((midButtonAbsPos && e->button() == Qt::MiddleButton)
            || (style()->styleHint(QStyle::SH_ScrollBar_LeftClickAbsolutePosition, &opt, this)
                && e->button() == Qt::LeftButton))) {
        int sliderLength = HORIZONTAL ? sr.width() : sr.height();
        setSliderPosition(d->pixelPosToRangeValue((HORIZONTAL ? e->position().toPoint().x()
                                                              : e->position().toPoint().y()) - sliderLength / 2));
        d->pressedControl = QStyle::SC_ScrollBarSlider;
        d->clickOffset = sliderLength / 2;
    }
    const int initialDelay = 500; // default threshold
    QElapsedTimer time;
    time.start();
    d->activateControl(d->pressedControl, initialDelay);
    repaint(style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this));
    if (time.elapsed() >= initialDelay && d->repeatActionTimer.isActive()) {
        // It took more than 500ms (the initial timer delay) to process
        // the control activation and repaint(), we therefore need
        // to restart the timer in case we have a pending mouse release event;
        // otherwise we'll get a timer event right before the release event,
        // causing the repeat action to be invoked twice on a single mouse click.
        // 50ms is the default repeat time (see activateControl/setRepeatAction).
        d->repeatActionTimer.start(50, this);
    }
    if (d->pressedControl == QStyle::SC_ScrollBarSlider)
        setSliderDown(true);
}